

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O1

void recall_tree_ns::compute_recall_lbest(recall_tree *b,node *n)

{
  node_pred *pnVar1;
  node_pred *pnVar2;
  node_pred *pnVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  float fVar7;
  
  if (0.0 < n->n) {
    pnVar2 = (n->preds)._begin;
    pnVar1 = (n->preds)._end;
    fVar7 = 0.0;
    if (pnVar2 != pnVar1) {
      pnVar3 = pnVar2 + b->max_candidates;
      dVar6 = 0.0;
      do {
        if (pnVar3 <= pnVar2) break;
        dVar6 = dVar6 + pnVar2->label_count;
        pnVar2 = pnVar2 + 1;
      } while (pnVar2 != pnVar1);
      fVar7 = (float)dVar6;
    }
    fVar5 = (float)n->n;
    fVar7 = fVar7 / fVar5;
    fVar5 = ((1.0 - fVar7) * fVar7) / fVar5;
    if (fVar5 < 0.0) {
      fVar5 = sqrtf(fVar5);
    }
    else {
      fVar5 = SQRT(fVar5);
    }
    dVar6 = n->n;
    fVar4 = b->bern_hyper;
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar7 = (fVar7 - fVar4 * fVar5) - (15.0 / ((float)dVar6 * 4.2426405)) * b->bern_hyper;
    if (fVar7 <= 0.0) {
      fVar7 = 0.0;
    }
    n->recall_lbest = fVar7;
  }
  return;
}

Assistant:

void compute_recall_lbest(recall_tree& b, node* n)
{
  if (n->n <= 0)
    return;

  double mass_at_k = 0;

  for (node_pred* ls = n->preds.begin(); ls != n->preds.end() && ls < n->preds.begin() + b.max_candidates; ++ls)
  {
    mass_at_k += ls->label_count;
  }

  float f = (float)mass_at_k / (float)n->n;
  float stdf = sqrt(f * (1.f - f) / (float)n->n);
  float diamf = 15.f / (sqrtf(18.f) * (float)n->n);

  // http://stackoverflow.com/questions/2789481/problem-calling-stdmax
  n->recall_lbest = (std::max)(0.f, f - sqrt(b.bern_hyper) * stdf - b.bern_hyper * diamf);
}